

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::loopback(TestMembraneImpl *this,LoopbackContext context)

{
  ClientHook *pCVar1;
  long *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> local_d8;
  StructReader local_c8;
  PointerReader local_98;
  PointerReader local_70;
  StructBuilder local_50;
  
  local_70.segment._0_1_ = 0;
  (**(code **)(*in_RDX + 0x10))(&local_98);
  local_c8.data = local_98.pointer;
  local_c8.segment = local_98.segment;
  local_c8.capTable = local_98.capTable;
  PointerBuilder::getStruct(&local_50,(PointerBuilder *)&local_c8,(StructSize)0x10000,(word *)0x0);
  (**(code **)*in_RDX)(&local_70);
  local_98.segment = (SegmentReader *)CONCAT71(local_70.segment._1_7_,local_70.segment._0_1_);
  local_98.pointer = local_70.pointer;
  local_98.nestingLimit = local_70.nestingLimit;
  local_98._28_4_ = local_70._28_4_;
  local_98.capTable = local_70.capTable;
  PointerReader::getStruct(&local_c8,&local_98,(word *)0x0);
  local_98.segment = local_c8.segment;
  local_98.capTable = local_c8.capTable;
  if (local_c8.pointerCount == 0) {
    local_c8.nestingLimit = 0x7fffffff;
    local_c8.pointers = (WirePointer *)0x0;
    local_98.segment = (SegmentReader *)0x0;
    local_98.capTable = (CapTableReader *)0x0;
  }
  local_98.nestingLimit = local_c8.nestingLimit;
  local_98.pointer = local_c8.pointers;
  PointerReader::getCapability(&local_70);
  local_d8.disposer = (Disposer *)CONCAT71(local_70.segment._1_7_,local_70.segment._0_1_);
  local_d8.ptr = (ClientHook *)local_70.capTable;
  local_98.segment = &(local_50.segment)->super_SegmentReader;
  local_98.capTable = &(local_50.capTable)->super_CapTableReader;
  local_98.pointer = local_50.pointers;
  PointerBuilder::setCapability((PointerBuilder *)&local_98,&local_d8);
  pCVar1 = local_d8.ptr;
  if (local_d8.ptr != (ClientHook *)0x0) {
    local_d8.ptr = (ClientHook *)0x0;
    (**(local_d8.disposer)->_vptr_Disposer)
              (local_d8.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  kj::_::readyNow();
  (this->super_Server)._vptr_Server = (_func_int **)local_c8.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> loopback(LoopbackContext context) override {
    context.getResults().setThing(context.getParams().getThing());
    return kj::READY_NOW;
  }